

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

string * lest::make_tran_string(string *__return_storage_ptr__,string *txt)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar1;
  char *pcVar2;
  ostringstream os;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (txt->_M_string_length != 0) {
    pcVar2 = (txt->_M_dataplus)._M_p;
    uVar1 = extraout_RDX;
    do {
      transformed_abi_cxx11_(&local_1c8,(lest *)(ulong)(uint)(int)*pcVar2,(char)uVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      uVar1 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
        uVar1 = extraout_RDX_01;
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != (txt->_M_dataplus)._M_p + txt->_M_string_length);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1c8._M_dataplus._M_p,
             local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_tran_string( std::string const & txt )
{
    std::ostringstream os;
    for( std::string::const_iterator pos = txt.begin(); pos != txt.end(); ++pos )
        os << transformed( *pos );
    return os.str();
}